

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::verifyUnsignedIntegerVec4
               (ResultCollector *result,QueriedState *state,UVec4 *expected)

{
  GLuint GVar1;
  DataType DVar2;
  GLUintVec4 *paGVar3;
  uint *puVar4;
  ostream *poVar5;
  ArrayPointer<unsigned_int> AVar6;
  string local_1e8;
  uint *local_1c8;
  int local_1c0;
  ArrayPointer<unsigned_int> local_1b8 [2];
  ostringstream local_198 [8];
  ostringstream buf;
  UVec4 *expected_local;
  QueriedState *state_local;
  ResultCollector *result_local;
  
  DVar2 = QueriedState::getType(state);
  if (DVar2 == DATATYPE_UNSIGNED_INTEGER_VEC4) {
    paGVar3 = QueriedState::getUintVec4Access(state);
    GVar1 = (*paGVar3)[0];
    puVar4 = tcu::Vector<unsigned_int,_4>::operator[](expected,0);
    if (GVar1 == *puVar4) {
      paGVar3 = QueriedState::getUintVec4Access(state);
      GVar1 = (*paGVar3)[1];
      puVar4 = tcu::Vector<unsigned_int,_4>::operator[](expected,1);
      if (GVar1 == *puVar4) {
        paGVar3 = QueriedState::getUintVec4Access(state);
        GVar1 = (*paGVar3)[2];
        puVar4 = tcu::Vector<unsigned_int,_4>::operator[](expected,2);
        if (GVar1 == *puVar4) {
          paGVar3 = QueriedState::getUintVec4Access(state);
          GVar1 = (*paGVar3)[3];
          puVar4 = tcu::Vector<unsigned_int,_4>::operator[](expected,3);
          if (GVar1 == *puVar4) {
            return;
          }
        }
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar5 = std::operator<<((ostream *)local_198,"Expected ");
    poVar5 = tcu::operator<<(poVar5,expected);
    poVar5 = std::operator<<(poVar5,", got ");
    paGVar3 = QueriedState::getUintVec4Access(state);
    AVar6 = tcu::formatArray<unsigned_int,4>((uint (*) [4])paGVar3);
    local_1c8 = AVar6.arr;
    local_1c0 = AVar6.size;
    local_1b8[0].arr = local_1c8;
    local_1b8[0].size = local_1c0;
    tcu::Format::operator<<(poVar5,local_1b8);
    std::__cxx11::ostringstream::str();
    tcu::ResultCollector::fail(result,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void verifyUnsignedIntegerVec4 (tcu::ResultCollector& result, QueriedState& state, const tcu::UVec4& expected)
{
	switch (state.getType())
	{
		case DATATYPE_UNSIGNED_INTEGER_VEC4:
		{
			if (state.getUintVec4Access()[0] != expected[0] ||
				state.getUintVec4Access()[1] != expected[1] ||
				state.getUintVec4Access()[2] != expected[2] ||
				state.getUintVec4Access()[3] != expected[3])
			{
				std::ostringstream buf;
				buf << "Expected " << expected << ", got " << tcu::formatArray(state.getUintVec4Access());
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}